

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlNewCDataBlock(xmlDocPtr doc,xmlChar *content,int len)

{
  xmlNodePtr pxVar1;
  xmlChar *pxVar2;
  xmlRegisterNodeFunc *pp_Var3;
  
  pxVar1 = (xmlNodePtr)(*xmlMalloc)(0x78);
  if (pxVar1 == (xmlNodePtr)0x0) {
    xmlTreeErrMemory("building CDATA");
  }
  else {
    pxVar1->_private = (void *)0x0;
    *(undefined8 *)&pxVar1->type = 0;
    pxVar1->doc = (_xmlDoc *)0x0;
    pxVar1->ns = (xmlNs *)0x0;
    pxVar1->nsDef = (xmlNs *)0x0;
    pxVar1->psvi = (void *)0x0;
    pxVar1->content = (xmlChar *)0x0;
    pxVar1->properties = (_xmlAttr *)0x0;
    pxVar1->next = (_xmlNode *)0x0;
    pxVar1->prev = (_xmlNode *)0x0;
    pxVar1->last = (_xmlNode *)0x0;
    pxVar1->parent = (_xmlNode *)0x0;
    pxVar1->line = 0;
    pxVar1->extra = 0;
    *(undefined4 *)&pxVar1->field_0x74 = 0;
    pxVar1->name = (xmlChar *)0x0;
    pxVar1->children = (_xmlNode *)0x0;
    pxVar1->type = XML_CDATA_SECTION_NODE;
    pxVar1->doc = doc;
    if (content != (xmlChar *)0x0) {
      pxVar2 = xmlStrndup(content,len);
      pxVar1->content = pxVar2;
    }
    if (__xmlRegisterCallbacks != 0) {
      pp_Var3 = __xmlRegisterNodeDefaultValue();
      if (*pp_Var3 != (xmlRegisterNodeFunc)0x0) {
        pp_Var3 = __xmlRegisterNodeDefaultValue();
        (**pp_Var3)(pxVar1);
      }
    }
  }
  return pxVar1;
}

Assistant:

xmlNodePtr
xmlNewCDataBlock(xmlDocPtr doc, const xmlChar *content, int len) {
    xmlNodePtr cur;

    /*
     * Allocate a new node and fill the fields.
     */
    cur = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (cur == NULL) {
	xmlTreeErrMemory("building CDATA");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlNode));
    cur->type = XML_CDATA_SECTION_NODE;
    cur->doc = doc;

    if (content != NULL) {
	cur->content = xmlStrndup(content, len);
    }

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue(cur);
    return(cur);
}